

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool check_more_than_two_unique_values<float,unsigned_long>
               (size_t nrows,size_t col,unsigned_long *Xc_indptr,unsigned_long *Xc_ind,float *Xc,
               MissingAction missing_action)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  
  if (1 < nrows) {
    uVar4 = Xc_indptr[col];
    uVar2 = Xc_indptr[col + 1];
    uVar5 = uVar2 - uVar4;
    if (uVar2 != uVar4) {
      bVar6 = uVar5 < nrows;
      if ((bVar6) &&
         ((int)ABS(Xc[uVar4]) - 1U < 0x7fffff || (int)ABS(Xc[uVar4]) - 0x800000U < 0x7f000000)) {
        return true;
      }
      fVar7 = 0.0;
      uVar3 = uVar4;
      if (uVar4 < uVar2) {
        do {
          fVar7 = Xc[uVar3];
          if ((uint)ABS(fVar7) < 0x7f800000) {
            if (nrows <= uVar5) {
              bVar6 = uVar5 < nrows || fVar7 == 0.0;
              goto LAB_002e3ae2;
            }
            if (fVar7 != 0.0) {
              return true;
            }
            if (NAN(fVar7)) {
              return true;
            }
          }
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
        fVar7 = 0.0;
      }
LAB_002e3ae2:
      if (uVar4 < uVar2) {
        do {
          fVar1 = Xc[uVar4];
          if ((uint)ABS(fVar1) < 0x7f800000) {
            if (((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) && (!(bool)(fVar1 == 0.0 & bVar6)))
            {
              return true;
            }
          }
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
    }
  }
  return false;
}

Assistant:

bool check_more_than_two_unique_values(size_t nrows, size_t col,
                                       sparse_ix *restrict Xc_indptr, sparse_ix *restrict Xc_ind, real_t *restrict Xc,
                                       MissingAction missing_action)
{
    if (nrows <= 1) return false;
    if (Xc_indptr[col+1] == Xc_indptr[col]) return false;
    bool has_zeros = nrows > (size_t)(Xc_indptr[col+1] - Xc_indptr[col]);
    if (has_zeros && !is_na_or_inf(Xc[Xc_indptr[col]]) && Xc[Xc_indptr[col]] != 0) return true;

    real_t x0 = 0;
    sparse_ix ix;
    for (ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
    {
        if (!is_na_or_inf(Xc[ix]))
        {
            if (has_zeros && Xc[ix] == 0) continue;
            if (has_zeros) return true;
            else if (Xc[ix] == 0) has_zeros = true;
            x0 = Xc[ix];
            ix++;
            break;
        }
    }

    for (ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
    {
        if (!is_na_or_inf(Xc[ix]))
        {
            if (has_zeros && Xc[ix] == 0) continue;
            if (Xc[ix] != x0) return true;
        }
    }

    return false;
}